

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O3

int TIFFSetupStrips(TIFF *tif)

{
  byte *pbVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong nmemb;
  int iVar5;
  
  uVar2 = (tif->tif_dir).td_fieldsset[0];
  if ((tif->tif_flags & 0x400) == 0) {
    if (((uVar2 >> 0x11 & 1) != 0) && ((tif->tif_dir).td_imagelength == 0)) {
LAB_002b42bf:
      nmemb = (ulong)(tif->tif_dir).td_samplesperpixel;
      goto LAB_002b41cf;
    }
    uVar2 = TIFFNumberOfStrips(tif);
  }
  else {
    if (((uVar2 & 4) != 0) && ((tif->tif_dir).td_imagelength == 0)) goto LAB_002b42bf;
    uVar2 = TIFFNumberOfTiles(tif);
  }
  nmemb = (ulong)uVar2;
LAB_002b41cf:
  uVar2 = (uint)nmemb;
  (tif->tif_dir).td_stripsperimage = uVar2;
  (tif->tif_dir).td_nstrips = uVar2;
  if (uVar2 < (uint)((tif->tif_flags & 0x80000) == 0) * 0x10000000 + 0x10000000) {
    if ((tif->tif_dir).td_planarconfig == 2) {
      (tif->tif_dir).td_stripsperimage = (uint32_t)(nmemb / (tif->tif_dir).td_samplesperpixel);
    }
    puVar3 = (uint64_t *)_TIFFCheckMalloc(tif,nmemb,8,"for \"StripOffsets\" array");
    (tif->tif_dir).td_stripoffset_p = puVar3;
    puVar4 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar4;
    puVar3 = (tif->tif_dir).td_stripoffset_p;
    iVar5 = 0;
    if (puVar4 != (uint64_t *)0x0 && puVar3 != (uint64_t *)0x0) {
      _TIFFmemset(puVar3,0,(ulong)(tif->tif_dir).td_nstrips << 3);
      _TIFFmemset((tif->tif_dir).td_stripbytecount_p,0,(ulong)(tif->tif_dir).td_nstrips << 3);
      pbVar1 = (byte *)((long)(tif->tif_dir).td_fieldsset + 3);
      *pbVar1 = *pbVar1 | 3;
      iVar5 = 1;
    }
  }
  else {
    iVar5 = 0;
    TIFFErrorExtR(tif,"TIFFSetupStrips","Too large Strip/Tile Offsets/ByteCounts arrays");
  }
  return iVar5;
}

Assistant:

int TIFFSetupStrips(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;

    if (isTiled(tif))
        td->td_stripsperimage = isUnspecified(tif, FIELD_TILEDIMENSIONS)
                                    ? td->td_samplesperpixel
                                    : TIFFNumberOfTiles(tif);
    else
        td->td_stripsperimage = isUnspecified(tif, FIELD_ROWSPERSTRIP)
                                    ? td->td_samplesperpixel
                                    : TIFFNumberOfStrips(tif);
    td->td_nstrips = td->td_stripsperimage;
    /* TIFFWriteDirectoryTagData has a limitation to 0x80000000U bytes */
    if (td->td_nstrips >=
        0x80000000U / ((tif->tif_flags & TIFF_BIGTIFF) ? 0x8U : 0x4U))
    {
        TIFFErrorExtR(tif, "TIFFSetupStrips",
                      "Too large Strip/Tile Offsets/ByteCounts arrays");
        return 0;
    }
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        td->td_stripsperimage /= td->td_samplesperpixel;
    td->td_stripoffset_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripOffsets\" array");
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripoffset_p == NULL || td->td_stripbytecount_p == NULL)
        return (0);
    /*
     * Place data at the end-of-file
     * (by setting offsets to zero).
     */
    _TIFFmemset(td->td_stripoffset_p, 0, td->td_nstrips * sizeof(uint64_t));
    _TIFFmemset(td->td_stripbytecount_p, 0, td->td_nstrips * sizeof(uint64_t));
    TIFFSetFieldBit(tif, FIELD_STRIPOFFSETS);
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    return (1);
}